

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

CNetMessage * __thiscall
V2Transport::GetReceivedMessage(V2Transport *this,microseconds time,bool *reject_message)

{
  long lVar1;
  string_view logging_function;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_type sVar3;
  size_t sVar4;
  undefined1 *in_RCX;
  rep in_RDX;
  long in_RSI;
  CNetMessage *in_RDI;
  long in_FS_OFFSET;
  microseconds in_stack_00000038;
  Level in_stack_00000050;
  unsigned_long *in_stack_00000060;
  long *in_stack_00000068;
  CNetMessage *msg;
  Span<const_unsigned_char> contents;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock49;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  msg_type;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  DataStream *in_stack_fffffffffffffeb0;
  DataStream *in_stack_fffffffffffffeb8;
  RecvState recv_state;
  V2Transport *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined4 uVar5;
  CNetMessage *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffee0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_fffffffffffffee8;
  Span<const_unsigned_char> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  CNetMessage *pCVar6;
  size_type local_b0;
  ConstevalFormatString<2U> in_stack_ffffffffffffff58;
  string_view in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff70;
  _Alloc_hider _Var7;
  bool *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar6 = in_RDI;
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffeac,(Mutex *)0x20b905);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                             );
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
             (char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
             SUB41((uint)in_stack_fffffffffffffec8 >> 0x18,0));
  if (*(char *)(in_RSI + 0x518) == '\x06') {
    V1Transport::GetReceivedMessage
              ((V1Transport *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
               in_stack_00000038,in_stack_ffffffffffffffa0);
  }
  else {
    inline_assertion_check<false,bool>
              ((bool *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (char *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
               (char *)in_stack_fffffffffffffeb0,
               (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffeb8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffeb0,
               (type)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    GetMessageType_abi_cxx11_(in_stack_fffffffffffffef8);
    _Var7._M_p = (char *)0x0;
    __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffff78;
    DataStream::DataStream
              ((DataStream *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    CNetMessage::CNetMessage
              (in_stack_fffffffffffffed0,
               (DataStream *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    DataStream::~DataStream
              ((DataStream *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    in_RDI->m_raw_message_size = (int)sVar3 + 0x14;
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    if (bVar2) {
      *in_RCX = 0;
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this_00,__str);
      (in_RDI->m_time).__r = in_RDX;
      sVar4 = Span<const_unsigned_char>::size
                        ((Span<const_unsigned_char> *)
                         CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      in_RDI->m_message_size = (uint32_t)sVar4;
      Span<const_unsigned_char>::size
                ((Span<const_unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      DataStream::resize(in_stack_fffffffffffffeb0,
                         CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                         (value_type)((ulong)in_stack_fffffffffffffeb8 >> 0x38));
      Span<const_unsigned_char>::begin
                ((Span<const_unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      Span<const_unsigned_char>::end
                ((Span<const_unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      DataStream::data(in_stack_fffffffffffffeb8);
      UCharCast((byte *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      std::copy<unsigned_char_const*,unsigned_char*>
                ((uchar *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (uchar *)in_stack_fffffffffffffec0,(uchar *)in_stack_fffffffffffffeb8);
      recv_state = (RecvState)((ulong)in_stack_fffffffffffffeb8 >> 0x38);
    }
    else {
      bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                                  Trace);
      recv_state = (RecvState)((ulong)in_stack_fffffffffffffeb8 >> 0x38);
      uVar5 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffecc);
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(uVar5,in_stack_fffffffffffffec8),(char *)in_stack_fffffffffffffec0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(uVar5,in_stack_fffffffffffffec8),(char *)in_stack_fffffffffffffec0);
        local_b0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        in_stack_fffffffffffffec0 = (V2Transport *)(in_RSI + 0x2e0);
        recv_state = (RecvState)((ulong)&local_b0 >> 0x38);
        in_stack_fffffffffffffea8 = 1;
        logging_function._M_str = _Var7._M_p;
        logging_function._M_len = in_stack_ffffffffffffff70;
        LogPrintFormatInternal<unsigned_long,long>
                  (logging_function,in_stack_ffffffffffffff60,(int)((ulong)pCVar6 >> 0x20),
                   (LogFlags)in_RDI,in_stack_00000050,in_stack_ffffffffffffff58,in_stack_00000060,
                   in_stack_00000068);
      }
      *in_RCX = 1;
    }
    ClearShrink<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    SetReceiveState(in_stack_fffffffffffffec0,recv_state);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pCVar6;
  }
  __stack_chk_fail();
}

Assistant:

CNetMessage V2Transport::GetReceivedMessage(std::chrono::microseconds time, bool& reject_message) noexcept
{
    AssertLockNotHeld(m_recv_mutex);
    LOCK(m_recv_mutex);
    if (m_recv_state == RecvState::V1) return m_v1_fallback.GetReceivedMessage(time, reject_message);

    Assume(m_recv_state == RecvState::APP_READY);
    Span<const uint8_t> contents{m_recv_decode_buffer};
    auto msg_type = GetMessageType(contents);
    CNetMessage msg{DataStream{}};
    // Note that BIP324Cipher::EXPANSION also includes the length descriptor size.
    msg.m_raw_message_size = m_recv_decode_buffer.size() + BIP324Cipher::EXPANSION;
    if (msg_type) {
        reject_message = false;
        msg.m_type = std::move(*msg_type);
        msg.m_time = time;
        msg.m_message_size = contents.size();
        msg.m_recv.resize(contents.size());
        std::copy(contents.begin(), contents.end(), UCharCast(msg.m_recv.data()));
    } else {
        LogDebug(BCLog::NET, "V2 transport error: invalid message type (%u bytes contents), peer=%d\n", m_recv_decode_buffer.size(), m_nodeid);
        reject_message = true;
    }
    ClearShrink(m_recv_decode_buffer);
    SetReceiveState(RecvState::APP);

    return msg;
}